

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

void __thiscall
kj::_::
Tuple<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
::
Tuple<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
          (Tuple<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
           *this,Array<char> *params,Maybe<kj::Array<char>_> *params_1,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *params_2)

{
  Array<char> *params_00;
  Maybe<kj::Array<char>_> *params_1_00;
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *params_2_00;
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *params_local_2;
  Maybe<kj::Array<char>_> *params_local_1;
  Array<char> *params_local;
  Tuple<kj::Array<char>,_kj::Maybe<kj::Array<char>_>,_kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_>
  *this_local;
  
  params_00 = fwd<kj::Array<char>>(params);
  params_1_00 = fwd<kj::Maybe<kj::Array<char>>>(params_1);
  params_2_00 = fwd<kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>(params_2);
  TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
  ::
  TupleImpl<kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
            ((TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Array<char>,kj::Maybe<kj::Array<char>>,kj::Maybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>>
              *)this,params_00,params_1_00,params_2_00);
  return;
}

Assistant:

constexpr Tuple(Params&&... params): impl(kj::fwd<Params>(params)...) {}